

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpMap<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  anon_class_24_3_6b4a22af f;
  anon_class_24_3_6b4a22af f_00;
  ErrnoSaver EVar7;
  char cVar8;
  uint uVar9;
  void *pvVar10;
  ParseContext *node;
  ulong uVar11;
  ushort *puVar12;
  uint *puVar13;
  ulong uVar14;
  char *pcVar15;
  uint7 uVar17;
  Nonnull<const_char_*> pcVar16;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar18;
  int iVar19;
  undefined8 extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *pPVar20;
  ParseContext *extraout_RDX_01;
  MapFieldBaseForParse *target;
  UntypedMapBase *this;
  int iVar21;
  long lVar22;
  ParseContext *ptr_00;
  ParseContext *msg_00;
  TcParseTableBase *table_00;
  FieldEntry *pFVar23;
  uint uVar24;
  pair<const_char_*,_int> pVar25;
  FieldAux *aux;
  UntypedMapBase *pUVar26;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_80;
  UntypedMapBase *local_78;
  __uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  _Stack_70;
  ParseContext **local_68;
  ParseContext *local_60;
  ZeroCopyInputStream *local_58;
  FieldEntry *local_50;
  UntypedMapBase *local_48;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *local_40;
  UntypedMapBase *local_38;
  ParseContext *ctx_00;
  
  pFVar23 = (FieldEntry *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)pFVar23 & 3) != 0) {
    AlignFail(pFVar23);
  }
  local_80.data =
       (long)&table->has_bits_offset + (ulong)pFVar23->aux_idx * 8 + (ulong)table->aux_offset;
  bVar2 = *(byte *)(local_80.data + 4);
  if (((bVar2 & 1) == 0) || (uVar9 = data.field_0._0_4_, (uVar9 & 7) != 2)) {
    pcVar15 = MpFallback(msg,ptr,ctx,data,table,hasbits);
    return pcVar15;
  }
  uVar4 = *(undefined4 *)
           ((long)&table->has_bits_offset + (ulong)pFVar23->aux_idx * 8 + (ulong)table->aux_offset);
  pvVar10 = MaybeGetSplitBase(msg,true,table);
  this = (UntypedMapBase *)((ulong)pFVar23->offset + (long)pvVar10);
  local_50 = pFVar23;
  if ((bVar2 & 2) == 0) {
    if (((ulong)this & 7) != 0) {
LAB_0044329a:
      AlignFail(this);
    }
    if (((undefined1  [32])*this & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      (*MapFieldBaseForParse::sync_map_with_repeated)(this,1);
    }
    this = (UntypedMapBase *)&this->table_;
  }
  else if (((ulong)this & 7) != 0) goto LAB_0044329a;
  local_58 = (ZeroCopyInputStream *)(ulong)CONCAT14(bVar2,uVar4);
  do {
    pPVar20 = (ParseContext *)(ulong)(this->type_info_).node_size;
    node = (ParseContext *)UntypedMapBase::AllocNode(this,(size_t)pPVar20);
    uVar11 = (ulong)(this->type_info_).node_size;
    uVar14 = uVar11 - 8;
    if (uVar14 < 8) {
      pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                          (uVar14,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
      pcVar15 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      iVar19 = 0xb2c;
LAB_00443261:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,pcVar15,iVar19,pcVar16);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_78);
    }
    (node->super_EpsCopyInputStream).buffer_end_ = (char *)0x0;
    pcVar15 = (node->super_EpsCopyInputStream).patch_buffer_ + (uVar11 - 0x30);
    pcVar15[0] = '\0';
    pcVar15[1] = '\0';
    pcVar15[2] = '\0';
    pcVar15[3] = '\0';
    pcVar15[4] = '\0';
    pcVar15[5] = '\0';
    pcVar15[6] = '\0';
    pcVar15[7] = '\0';
    f.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
           *)&local_48;
    f.this = this;
    f.node = (NodeBase **)&local_60;
    local_78 = this;
    _Stack_70._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )(tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )&local_48;
    local_68 = &local_60;
    local_60 = node;
    local_48 = this;
    UntypedMapBase::
    VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
              (this,f);
    local_40 = &local_80;
    f_00.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
              *)&local_48;
    f_00.this = this;
    f_00.node = (NodeBase **)&local_60;
    local_78 = this;
    _Stack_70._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )(tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )&local_48;
    local_68 = &local_60;
    local_60 = node;
    local_48 = this;
    local_38 = this;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              (this,f_00);
    bVar3 = (byte)*(ushort *)ptr;
    aVar18.data._1_7_ = 0;
    aVar18.data._0_1_ = bVar3;
    if ((char)bVar3 < '\0') {
      pPVar20 = (ParseContext *)(ulong)(uint)bVar3;
      pVar25 = ReadSizeFallback(ptr,(uint)bVar3);
      ctx_00 = pVar25._8_8_;
      if (pVar25.first == (char *)0x0) goto LAB_0044315e;
      aVar18.data = (ulong)ctx_00 & 0xffffffff;
    }
    else {
      pVar25._8_8_ = extraout_RDX;
      pVar25.first = (char *)((long)ptr + 1);
    }
    ctx_00 = pVar25._8_8_;
    ptr_00 = (ParseContext *)pVar25.first;
    if (ctx->depth_ < 1) {
LAB_0044315e:
      if (this->arena_ == (Arena *)0x0) {
        UntypedMapBase::DeleteNode(this,(NodeBase *)node);
        ctx_00 = extraout_RDX_01;
        pPVar20 = node;
      }
      pcVar15 = Error(msg,(char *)pPVar20,ctx_00,(TcFieldData)aVar18,table,hasbits);
      return pcVar15;
    }
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)&local_78,(char *)ctx,(int)pVar25.first);
    EVar7.saved_errno_ = local_78._0_4_;
    lVar22 = (long)ctx->depth_ + -1;
    iVar21 = (int)lVar22;
    ctx->depth_ = iVar21;
    aVar18 = local_80;
    msg_00 = node;
    table_00 = table;
    pFVar23 = local_50;
    pUVar26 = this;
    puVar12 = (ushort *)
              ParseOneMapEntry((NodeBase *)node,(char *)ptr_00,ctx,(FieldAux *)local_80,table,
                               local_50,this);
    iVar19 = ctx->depth_;
    if ((puVar12 != (ushort *)0x0) && (iVar21 != iVar19)) {
      pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (lVar22,(long)iVar19,"old_depth == depth_");
      pcVar15 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
      ;
      iVar19 = 0x481;
      goto LAB_00443261;
    }
    ctx->depth_ = iVar19 + 1;
    uVar24 = EVar7.saved_errno_ + (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar24;
    ctx_00 = extraout_RDX_00;
    pPVar20 = ptr_00;
    if (((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) ||
       ((ctx->super_EpsCopyInputStream).limit_end_ =
             (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar24 >> 0x1f & uVar24),
       puVar12 == (ushort *)0x0)) goto LAB_0044315e;
    pPVar20 = extraout_RDX_00;
    if ((bVar2 & 0x10) == 0) {
LAB_00442ff3:
      if (5 < (SUB41(this->type_info_,3) & 0xf)) {
switchD_00443018_caseD_3:
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0xb68);
      }
      uVar24 = (uint)this->type_info_ >> 0x18 & 0xf;
      puVar13 = &switchD_00443018::switchdataD_006cb49c;
      uVar14 = (ulong)(int)(&switchD_00443018::switchdataD_006cb49c)[uVar24];
      pcVar15 = (char *)((long)&switchD_00443018::switchdataD_006cb49c + uVar14);
      cVar8 = (char)pcVar15;
      switch(uVar24) {
      case 0:
switchD_00443018_caseD_0:
        KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)this,(KeyNode *)node);
        break;
      case 1:
switchD_00443018_caseD_1:
        KeyMapBase<unsigned_int>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_int> *)this,(KeyNode *)node);
        break;
      case 2:
switchD_00443018_caseD_2:
        KeyMapBase<unsigned_long>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_long> *)this,(KeyNode *)node);
        break;
      default:
        goto switchD_00443018_caseD_3;
      case 5:
switchD_00443018_caseD_5:
        KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InsertOrReplaceNode
                  ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,(KeyNode *)node);
        break;
      case 6:
switchD_00443018_caseD_6:
        switch(uVar24) {
        case 0:
          goto switchD_00443018_caseD_0;
        case 1:
          goto switchD_00443018_caseD_1;
        case 2:
          goto switchD_00443018_caseD_2;
        default:
          goto switchD_00443018_caseD_3;
        case 5:
          goto switchD_00443018_caseD_5;
        case 6:
          goto switchD_00443018_caseD_6;
        case 7:
          goto switchD_00443018_caseD_7;
        case 8:
          goto switchD_00443018_caseD_8;
        case 9:
          goto switchD_00443018_caseD_9;
        case 10:
          goto switchD_00443018_caseD_a;
        case 0xb:
          goto switchD_00443018_caseD_b;
        case 0xc:
          goto switchD_00443018_caseD_c;
        case 0xd:
        case 0xe:
          goto switchD_00443018_caseD_d;
        case 0xf:
          goto switchD_00443018_caseD_f;
        }
      case 7:
switchD_00443018_caseD_7:
        pcVar15 = (char *)((long)&UINT_006cb41c + uVar14 + 3);
        *pcVar15 = *pcVar15 + -100;
        halt_baddata();
      case 8:
switchD_00443018_caseD_8:
        pcVar1 = msg_00[0xf877].super_EpsCopyInputStream.patch_buffer_ + 0x1b;
        *pcVar1 = *pcVar1 + cVar8;
        UINT_006cb41c._1_1_ = 0x86;
        *(char *)&(pPVar20->super_EpsCopyInputStream).limit_end_ =
             *(char *)&(pPVar20->super_EpsCopyInputStream).limit_end_ + cVar8;
switchD_00443018_caseD_9:
        *pcVar15 = *pcVar15 + cVar8;
        if (*pcVar15 != '\0') {
          pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              ((long)pcVar15,0x200,"xform_val == +field_layout::kTvZigZag");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&stack0xffffffffffffff38,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0x87a,pcVar16);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&stack0xffffffffffffff38);
        }
        pcVar15 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                            ((MessageLite *)msg_00,(char *)ptr_00,pPVar20,(TcFieldData)0x6cb49c,
                             table_00,(uint64_t)pFVar23);
        return pcVar15;
      case 9:
        goto switchD_00443018_caseD_9;
      case 10:
switchD_00443018_caseD_a:
        do {
        } while( true );
      case 0xb:
switchD_00443018_caseD_b:
        pcVar15 = (char *)(ulong)(*(byte *)((long)&(msg_00->super_EpsCopyInputStream).buffer_end_ +
                                           7) & 0xf);
      case 0xf:
switchD_00443018_caseD_f:
        if (5 < (uint)pcVar15) {
          UntypedMapBase::
          VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                    ();
        }
        puVar13 = &switchD_00446dcc::switchdataD_006cb4c4;
code_r0x00446dc5:
        pcVar15 = (char *)(*(code *)((long)(int)puVar13[(long)pcVar15] + (long)puVar13))();
        return pcVar15;
      case 0xc:
switchD_00443018_caseD_c:
        if (SCARRY8(uVar14,0x6cb49c) != (long)pcVar15 < 0) {
          return (char *)pUVar26;
        }
        pcVar1 = (char *)((long)&UINT_006cb428 + uVar14 + 1);
        *pcVar1 = *pcVar1 + -100 + (0xffffffffff934b63 < uVar14);
        pcVar15 = (char *)(ulong)((uint)pcVar15 | 0x2846ff);
        goto code_r0x00446dc5;
      case 0xd:
      case 0xe:
switchD_00443018_caseD_d:
        *pcVar15 = *pcVar15 - (char)table_00;
        goto code_r0x00446dc5;
      }
    }
    else {
      puVar13 = (uint *)UntypedMapBase::GetValue<int>(this,(NodeBase *)node);
      uVar24 = *puVar13;
      puVar13 = *(uint **)(local_80.data + 8);
      ptr_00 = (ParseContext *)(long)(short)*puVar13;
      msg_00 = (ParseContext *)(ulong)(*puVar13 >> 0x10);
      pPVar20 = (ParseContext *)(((long)(int)uVar24 - (long)ptr_00) - (long)msg_00);
      if ((ParseContext *)((long)(int)uVar24 - (long)ptr_00) < msg_00) goto LAB_00442ff3;
      uVar5 = puVar13[1];
      ptr_00 = (ParseContext *)(ulong)uVar5;
      msg_00 = (ParseContext *)(ulong)(ushort)uVar5;
      if (msg_00 <= pPVar20) {
        pPVar20 = (ParseContext *)(ulong)(uVar5 >> 0x10);
        ptr_00 = (ParseContext *)0x0;
        do {
          if (pPVar20 <= ptr_00) goto LAB_004430aa;
          uVar6 = *(uint *)((long)puVar13 + (long)ptr_00 * 4 + (ulong)(uVar5 >> 3 & 0x1ffc) + 8);
          msg_00 = (ParseContext *)(ulong)uVar6;
          table_00 = (TcParseTableBase *)(ulong)((int)uVar24 < (int)uVar6);
          ptr_00 = (ParseContext *)(((long)ptr_00 * 2 - (long)table_00) + 2);
        } while (uVar6 != uVar24);
        goto LAB_00442ff3;
      }
      if ((puVar13[((ulong)pPVar20 >> 5) + 2] >> ((uint)pPVar20 & 0x1f) & 1) != 0)
      goto LAB_00442ff3;
LAB_004430aa:
      WriteMapEntryAsUnknown(msg,table,this,uVar9,(NodeBase *)node,SUB85(local_58,0));
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar12) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar13 & 3) != 0) {
          AlignFail();
        }
        *puVar13 = *puVar13 | (uint)hasbits;
      }
      return (char *)puVar12;
    }
    bVar3 = (byte)*puVar12;
    uVar24 = (uint)bVar3;
    ptr = (char *)((long)puVar12 + 1);
    if ((char)bVar3 < '\0') {
      uVar17 = (uint7)(((ulong)bVar3 << 0x39) >> 8);
      lVar22 = CONCAT71(uVar17,*ptr);
      if (*ptr < '\0') {
        uVar17 = uVar17 >> 7 | (uint7)((ulong)(lVar22 << 0x39) >> 8);
        lVar22 = CONCAT71(uVar17,(byte)puVar12[1]);
        if ((char)(byte)puVar12[1] < '\0') {
          uVar17 = uVar17 >> 7 | (uint7)((ulong)(lVar22 << 0x39) >> 8);
          lVar22 = CONCAT71(uVar17,*(byte *)((long)puVar12 + 3));
          if ((char)*(byte *)((long)puVar12 + 3) < '\0') {
            uVar17 = uVar17 >> 7 | (uint7)((ulong)(lVar22 << 0x39) >> 8);
            if ((char)(byte)puVar12[2] < '\0') {
              uVar24 = 0;
              ptr = (char *)0x0;
            }
            else {
              uVar24 = (int)CONCAT71(uVar17,(byte)puVar12[2]) << 0x1c | (uint)(uVar17 >> 0x1c);
              ptr = (char *)((long)puVar12 + 5);
            }
          }
          else {
            uVar24 = (int)lVar22 << 0x15 | (uint)(uVar17 >> 0x23);
            ptr = (char *)(puVar12 + 2);
          }
        }
        else {
          uVar24 = (int)lVar22 << 0xe | (uint)(uVar17 >> 0x2a);
          ptr = (char *)((long)puVar12 + 3);
        }
      }
      else {
        uVar24 = (int)lVar22 << 7 | (uint)(((ulong)bVar3 << 0x39) >> 0x39);
        ptr = (char *)(puVar12 + 1);
      }
    }
    if (uVar24 != uVar9) {
      uVar9 = (uint)table->fast_idx_mask & (uint)*puVar12;
      if ((uVar9 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar14 = (ulong)(uVar9 & 0xfffffff8);
      pcVar15 = (char *)(**(code **)(&table[1].has_bits_offset + uVar14))
                                  (msg,puVar12,ctx,
                                   (ulong)*puVar12 ^
                                   *(ulong *)(&table[1].fast_idx_mask + uVar14 * 2),table,hasbits);
      return pcVar15;
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMap(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // `aux[0]` points into a MapAuxInfo.
  // If we have a message mapped_type aux[1] points into a `create_in_arena`.
  // If we have a validated enum mapped_type aux[1] point into a
  // `enum_data`.
  const auto* aux = table->field_aux(&entry);
  const auto map_info = aux[0].map_info;

  if (ABSL_PREDICT_FALSE(!map_info.is_supported ||
                         (data.tag() & 7) !=
                             WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    PROTOBUF_MUSTTAIL return MpFallback(PROTOBUF_TC_PARAM_PASS);
  }

  // When using LITE, the offset points directly into the Map<> object.
  // Otherwise, it points into a MapField and we must synchronize with
  // reflection. It is done by calling the MutableMap() virtual function on the
  // field's base class.
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  UntypedMapBase& map =
      map_info.use_lite
          ? RefAt<UntypedMapBase>(base, entry.offset)
          : *RefAt<MapFieldBaseForParse>(base, entry.offset).MutableMap();

  const uint32_t saved_tag = data.tag();

  while (true) {
    NodeBase* node = map.AllocNode();
    char* const node_end =
        reinterpret_cast<char*>(node) + map.type_info().node_size;
    void* const node_key = node->GetVoidKey();

    // Due to node alignment we can guarantee that we have at least 8 writable
    // bytes from the key position to the end of the node.
    // We can initialize the first and last 8 bytes, which takes care of all the
    // scalar value types. This makes the VisitXXX calls below faster because
    // the switch is much smaller.
    // Assert this in debug mode, just in case.
    ABSL_DCHECK_GE(node_end - static_cast<char*>(node_key), sizeof(uint64_t));
    memset(node_key, 0, sizeof(uint64_t));
    memset(node_end - sizeof(uint64_t), 0, sizeof(uint64_t));

    map.VisitKey(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    map.VisitValue(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  [&](MessageLite* msg) {
                    aux[1].table->class_data->PlacementNew(msg, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
      return ParseOneMapEntry(node, ptr, ctx, aux, table, entry, map);
    });

    if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
      // Parsing failed. Delete the node that we didn't insert.
      if (map.arena() == nullptr) map.DeleteNode(node);
      PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    if (ABSL_PREDICT_FALSE(
            map_info.value_is_validated_enum &&
            !internal::ValidateEnumInlined(*map.GetValue<int32_t>(node),
                                           aux[1].enum_data))) {
      WriteMapEntryAsUnknown(msg, table, map, saved_tag, node, map_info);
    } else {
      // Done parsing the node, insert it.
      switch (map.type_info().key_type_kind()) {
        case UntypedMapBase::TypeKind::kBool:
          static_cast<KeyMapBase<bool>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<bool>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU32:
          static_cast<KeyMapBase<uint32_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint32_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU64:
          static_cast<KeyMapBase<uint64_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint64_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kString:
          static_cast<KeyMapBase<std::string>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<std::string>::KeyNode*>(node));
          break;
        default:
          Unreachable();
      }
    }

    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) {
      PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    uint32_t next_tag;
    const char* ptr2 = ReadTagInlined(ptr, &next_tag);
    if (next_tag != saved_tag) break;
    ptr = ptr2;
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}